

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void gen_codes(ct_data *tree,int max_code,uint16_t *bl_count)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  int bits;
  long lVar4;
  uint16_t next_code [16];
  
  uVar3 = 0;
  for (lVar4 = 1; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    uVar3 = (uVar3 + bl_count[lVar4 + -1]) * 2;
    next_code[lVar4] = uVar3;
  }
  for (lVar4 = 0; lVar4 <= max_code; lVar4 = lVar4 + 1) {
    uVar1 = tree[lVar4].dl.dad;
    if (uVar1 != 0) {
      uVar2 = next_code[uVar1];
      next_code[uVar1] = uVar2 + 1;
      uVar3 = zng_bi_reverse((uint)uVar2,(uint)uVar1);
      tree[lVar4].fc.freq = uVar3;
    }
  }
  return;
}

Assistant:

Z_INTERNAL void gen_codes(ct_data *tree, int max_code, uint16_t *bl_count) {
    /* tree: the tree to decorate */
    /* max_code: largest code with non zero frequency */
    /* bl_count: number of codes at each bit length */
    uint16_t next_code[MAX_BITS+1];  /* next code value for each bit length */
    unsigned int code = 0;           /* running code value */
    int bits;                        /* bit index */
    int n;                           /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        code = (code + bl_count[bits-1]) << 1;
        next_code[bits] = (uint16_t)code;
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert(code + bl_count[MAX_BITS]-1 == (1 << MAX_BITS)-1, "inconsistent bit counts");
    Tracev((stderr, "\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0)
            continue;
        /* Now reverse the bits */
        tree[n].Code = PREFIX(bi_reverse)(next_code[len]++, len);

        Tracecv(tree != static_ltree, (stderr, "\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n & 0xff) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}